

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_(date::detail::classify)4>
          *t)

{
  uchar uVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  save_stream<char,_std::char_traits<char>_> _;
  
  save_stream<char,_std::char_traits<char>_>::save_stream(&_,os);
  if ((t->super_time_of_day_base).neg_ == true) {
    std::operator<<((ostream *)os,'-');
  }
  lVar2 = *(long *)(*(long *)os + -0x18);
  std::ios::fill();
  os[lVar2 + 0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
  lVar2 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar2 + -0x18) + 0x18) = 0x82;
  if (1 < (byte)((t->super_time_of_day_base).mode_ - 1)) {
    *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  }
  poVar3 = std::ostream::_M_insert<long>((long)os);
  std::operator<<(poVar3,':');
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<long>((long)os);
  poVar3 = std::operator<<(poVar3,':');
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,&t->s_);
  uVar1 = (t->super_time_of_day_base).mode_;
  if (uVar1 == '\x01') {
    pcVar4 = "am";
  }
  else {
    if (uVar1 != '\x02') goto LAB_00108310;
    pcVar4 = "pm";
  }
  std::operator<<((ostream *)os,pcVar4);
LAB_00108310:
  save_stream<char,_std::char_traits<char>_>::~save_stream(&_);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const time_of_day_storage& t)
    {
        using namespace std;
        detail::save_stream<CharT, Traits> _(os);
        if (t.neg_)
            os << '-';
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        if (t.mode_ != am && t.mode_ != pm)
            os.width(2);
        os << t.h_.count() << ':';
        os.width(2);
        os << t.m_.count() << ':' << t.s_;
        switch (t.mode_)
        {
        case am:
            os << "am";
            break;
        case pm:
            os << "pm";
            break;
        }
        return os;
    }